

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O3

void __thiscall
Js::JavascriptSet::ExtractSnapObjectDataInto
          (JavascriptSet *this,SnapObject *objData,SlabAllocator *alloc)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint *puVar4;
  void **ppvVar5;
  undefined1 local_38 [8];
  Iterator iter;
  
  puVar4 = (uint *)TTD::SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
  *puVar4 = 0;
  iVar3 = Size(this);
  if (iVar3 == 0) {
    puVar4[2] = 0;
    puVar4[3] = 0;
  }
  else {
    iVar3 = Size(this);
    ppvVar5 = TTD::SlabAllocatorBase<0>::SlabAllocateArray<void*>(alloc,(long)iVar3);
    *(void ***)(puVar4 + 2) = ppvVar5;
    Memory::Recycler::WBSetBit((char *)local_38);
    local_38 = (undefined1  [8])&this->list;
    Memory::RecyclerWriteBarrierManager::WriteBarrier((Iterator *)local_38);
    iter.list.ptr = (MapOrSetDataList<void_*> *)0x0;
    bVar2 = MapOrSetDataList<void_*>::Iterator::Next((Iterator *)local_38);
    if (bVar2) {
      do {
        uVar1 = *puVar4;
        *(MapOrSetDataNode<void_*> **)(*(long *)(puVar4 + 2) + (ulong)uVar1 * 8) =
             iter.list.ptr[1].first.ptr;
        *puVar4 = uVar1 + 1;
        bVar2 = MapOrSetDataList<void_*>::Iterator::Next((Iterator *)local_38);
      } while (bVar2);
    }
  }
  if (objData->SnapObjectTag != SnapSetObject) {
    TTDAbort_unrecoverable_error("Tag does not match.");
  }
  objData->AddtlSnapObjectInfo = puVar4;
  return;
}

Assistant:

void JavascriptSet::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
{
    TTD::NSSnapObjects::SnapSetInfo* ssi = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapSetInfo>();
    ssi->SetSize = 0;

    if(this->Size() == 0)
    {
        ssi->SetValueArray = nullptr;
    }
    else
    {
        ssi->SetValueArray = alloc.SlabAllocateArray<TTD::TTDVar>(this->Size());

        auto iter = this->GetIterator();
        while(iter.Next())
        {
            ssi->SetValueArray[ssi->SetSize] = iter.Current();
            ssi->SetSize++;
        }
    }

    TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapSetInfo*, TTD::NSSnapObjects::SnapObjectType::SnapSetObject>(objData, ssi);
}